

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_ext_term(lysc_ext_instance *ext,char *name,void *value,size_t value_len,
                       uint32_t options,lyd_node **node)

{
  ly_ctx *local_78;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_VALUE_FORMAT format;
  ly_bool store_only;
  ly_ctx *ctx;
  lysc_node *schema;
  lyd_node *ret;
  lyd_node **pplStack_40;
  LY_ERR rc;
  lyd_node **node_local;
  size_t sStack_30;
  uint32_t options_local;
  size_t value_len_local;
  void *value_local;
  char *name_local;
  lysc_ext_instance *ext_local;
  
  schema = (lysc_node *)0x0;
  if (ext == (lysc_ext_instance *)0x0) {
    local_78 = (ly_ctx *)0x0;
  }
  else {
    local_78 = ext->module->ctx;
  }
  _format = local_78;
  ret__._3_1_ = (options & 2) != 0;
  pplStack_40 = node;
  node_local._4_4_ = options;
  sStack_30 = value_len;
  value_len_local = (size_t)value;
  value_local = name;
  name_local = (char *)ext;
  if (ext == (lysc_ext_instance *)0x0) {
    ly_log(local_78,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ext","lyd_new_ext_term");
    ext_local._4_4_ = LY_EINVAL;
  }
  else if (node == (lyd_node **)0x0) {
    ly_log(local_78,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","lyd_new_ext_term");
    ext_local._4_4_ = LY_EINVAL;
  }
  else if (name == (char *)0x0) {
    ly_log(local_78,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_ext_term");
    ext_local._4_4_ = LY_EINVAL;
  }
  else {
    ext_local._4_4_ = lyd_new_val_get_format(options,&ret___1);
    if (ext_local._4_4_ == LY_SUCCESS) {
      if ((ret__._3_1_ == LY_SUCCESS >> 0x18) ||
         ((ret___1 != LY_SUCCESS && (ret___1 != LY_ENOTFOUND)))) {
        ctx = (ly_ctx *)
              lysc_ext_find_node((lysc_ext_instance *)name_local,(lys_module *)0x0,
                                 (char *)value_local,0,0xc,0);
        if (ctx == (ly_ctx *)0x0) {
          if (*(long *)(name_local + 8) == 0) {
            ly_log(_format,LY_LLERR,LY_EINVAL,
                   "Term node \"%s\" not found in instance of extension %s.",value_local,
                   **(undefined8 **)name_local);
          }
          else {
            ly_log(_format,LY_LLERR,LY_EINVAL,
                   "Term node \"%s\" not found in instance \"%s\" of extension %s.",value_local,
                   *(undefined8 *)(name_local + 8),**(undefined8 **)name_local);
          }
          ext_local._4_4_ = LY_ENOTFOUND;
        }
        else {
          ext_local._4_4_ =
               lyd_create_term((lysc_node *)ctx,(char *)value_len_local,sStack_30,'\0',ret__._3_1_,
                               (ly_bool *)0x0,ret___1,(void *)0x0,0x3f3,(ly_bool *)0x0,
                               (lyd_node **)&schema);
          if (ext_local._4_4_ == LY_SUCCESS) {
            *pplStack_40 = (lyd_node *)schema;
            ext_local._4_4_ = LY_SUCCESS;
          }
        }
      }
      else {
        ly_log(_format,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
               "!(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB))",
               "lyd_new_ext_term");
        ext_local._4_4_ = LY_EINVAL;
      }
    }
  }
  return ext_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_term(const struct lysc_ext_instance *ext, const char *name, const void *value, size_t value_len,
        uint32_t options, struct lyd_node **node)
{
    LY_ERR rc;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    LY_VALUE_FORMAT format;

    LY_CHECK_ARG_RET(ctx, ext, node, name, LY_EINVAL);
    LY_CHECK_RET(lyd_new_val_get_format(options, &format));
    LY_CHECK_ARG_RET(ctx, !(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB)), LY_EINVAL);

    schema = lysc_ext_find_node(ext, NULL, name, 0, LYD_NODE_TERM, 0);
    if (!schema) {
        if (ext->argument) {
            LOGERR(ctx, LY_EINVAL, "Term node \"%s\" not found in instance \"%s\" of extension %s.",
                    name, ext->argument, ext->def->name);
        } else {
            LOGERR(ctx, LY_EINVAL, "Term node \"%s\" not found in instance of extension %s.", name, ext->def->name);
        }
        return LY_ENOTFOUND;
    }
    rc = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &ret);
    LY_CHECK_RET(rc);

    *node = ret;

    return LY_SUCCESS;
}